

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_device_uninit__pulse(ma_device *pDevice)

{
  ma_context *pmVar1;
  void *pvVar2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_device_type mVar4;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x45b0,"ma_result ma_device_uninit__pulse(ma_device *)");
  }
  pmVar1 = pDevice->pContext;
  if (pmVar1 != (ma_context *)0x0) {
    mVar4 = pDevice->type;
    if ((mVar4 & ~ma_device_type_playback) == ma_device_type_capture) {
      (*(pmVar1->field_14).alsa.snd_pcm_format_mask_test)
                ((pDevice->field_24).alsa.pPollDescriptorsCapture);
      (*(pmVar1->field_14).alsa.snd_pcm_sw_params_set_stop_threshold)
                ((pDevice->field_24).alsa.pPollDescriptorsCapture);
      mVar4 = pDevice->type;
    }
    if ((mVar4 | ma_device_type_capture) == ma_device_type_duplex) {
      (*(pmVar1->field_14).alsa.snd_pcm_format_mask_test)
                ((pDevice->field_24).alsa.pPollDescriptorsPlayback);
      (*(pmVar1->field_14).alsa.snd_pcm_sw_params_set_stop_threshold)
                ((pDevice->field_24).alsa.pPollDescriptorsPlayback);
      if ((((pDevice->type == ma_device_type_duplex) &&
           ((pDevice->duplexRB).rb.rb.ownsBuffer != '\0')) &&
          (pvVar2 = *(void **)((long)(pDevice->duplexRB).rb.rb.pBuffer + -8), pvVar2 != (void *)0x0)
          ) && (p_Var3 = (pDevice->duplexRB).rb.rb.allocationCallbacks.onFree,
               p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
        (*p_Var3)(pvVar2,(pDevice->duplexRB).rb.rb.allocationCallbacks.pUserData);
      }
    }
    (*(pmVar1->field_14).alsa.snd_pcm_hw_params_get_rate_max)((pDevice->field_24).alsa.pPCMCapture);
    (*(pmVar1->field_14).alsa.snd_pcm_hw_params_get_rate)((pDevice->field_24).alsa.pPCMCapture);
    (*(pmVar1->field_14).alsa.snd_pcm_close)((pDevice->field_24).alsa.pPCMPlayback);
    return MA_SUCCESS;
  }
  __assert_fail("pContext != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x45b3,"ma_result ma_device_uninit__pulse(ma_device *)");
}

Assistant:

static ma_result ma_device_uninit__pulse(ma_device* pDevice)
{
    ma_context* pContext;

    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        ((ma_pa_stream_disconnect_proc)pContext->pulse.pa_stream_disconnect)((ma_pa_stream*)pDevice->pulse.pStreamCapture);
        ((ma_pa_stream_unref_proc)pContext->pulse.pa_stream_unref)((ma_pa_stream*)pDevice->pulse.pStreamCapture);
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        ((ma_pa_stream_disconnect_proc)pContext->pulse.pa_stream_disconnect)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
        ((ma_pa_stream_unref_proc)pContext->pulse.pa_stream_unref)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
    }

    if (pDevice->type == ma_device_type_duplex) {
        ma_duplex_rb_uninit(&pDevice->duplexRB);
    }

    ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)((ma_pa_context*)pDevice->pulse.pPulseContext);
    ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)((ma_pa_context*)pDevice->pulse.pPulseContext);
    ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)((ma_pa_mainloop*)pDevice->pulse.pMainLoop);

    return MA_SUCCESS;
}